

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O3

int Extra_ThreshSelectWeights3(word *t,int nVars,int *pW)

{
  uint uVar1;
  int Cost;
  int iVar2;
  uint uVar3;
  int i;
  long lVar4;
  uint uVar5;
  int Cost_1;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  bool bVar10;
  
  if (nVars != 3) {
    __assert_fail("nVars == 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/extrab/extraBddThresh.c"
                  ,0xa3,"int Extra_ThreshSelectWeights3(word *, int, int *)");
  }
  pW[2] = 1;
  uVar3 = 1;
  do {
    pW[1] = uVar3;
    uVar5 = uVar3;
    do {
      *pW = uVar5;
      uVar1 = uVar5;
      do {
        iVar2 = 10000;
        iVar6 = 0;
        uVar8 = 0;
        while( true ) {
          uVar7 = (uint)uVar8;
          lVar4 = 0;
          if ((t[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) == 0) {
            iVar9 = 0;
            do {
              if ((uVar7 >> ((uint)lVar4 & 0x1f) & 1) != 0) {
                iVar9 = iVar9 + pW[lVar4];
              }
              lVar4 = lVar4 + 1;
            } while (lVar4 != 3);
            if (iVar6 <= iVar9) {
              iVar6 = iVar9;
            }
          }
          else {
            iVar9 = 0;
            do {
              if ((uVar7 >> ((uint)lVar4 & 0x1f) & 1) != 0) {
                iVar9 = iVar9 + pW[lVar4];
              }
              lVar4 = lVar4 + 1;
            } while (lVar4 != 3);
            if (iVar9 <= iVar2) {
              iVar2 = iVar9;
            }
          }
          if (iVar2 <= iVar6) break;
          uVar8 = (ulong)(uVar7 + 1);
          if (uVar7 + 1 == 8) {
            return iVar2;
          }
        }
        *pW = uVar1 + 1;
        bVar10 = uVar1 < 3;
        uVar1 = uVar1 + 1;
      } while (bVar10);
      uVar5 = uVar5 + 1;
      pW[1] = uVar5;
    } while (uVar5 != 4);
    uVar3 = uVar3 + 1;
    pW[2] = uVar3;
    if (uVar3 == 4) {
      return 0;
    }
  } while( true );
}

Assistant:

int Extra_ThreshSelectWeights3(word * t, int nVars, int * pW) {
	int m, Lmin, Lmax, nMints = (1 << nVars);
	assert(nVars == 3);
	for (pW[2] = 1; pW[2] <= nVars; pW[2]++)
		for (pW[1] = pW[2]; pW[1] <= nVars; pW[1]++)
			for (pW[0] = pW[1]; pW[0] <= nVars; pW[0]++) {
				Lmin = 10000;
				Lmax = 0;
				for (m = 0; m < nMints; m++) {
					if (Abc_TtGetBit(t, m))
						Lmin = Abc_MinInt(Lmin,
								Extra_ThreshWeightedSum(pW, nVars, m));
					else
						Lmax = Abc_MaxInt(Lmax,
								Extra_ThreshWeightedSum(pW, nVars, m));
					if (Lmax >= Lmin)
						break;
//            printf( "%c%d ", Abc_TtGetBit(t, m) ? '+' : '-', Extra_ThreshWeightedSum(pW, nVars, m) );
				}
//        printf( "  -%d +%d\n", Lmax, Lmin );
				if (m < nMints)
					continue;
				assert(Lmax < Lmin);
				return Lmin;
			}
	return 0;
}